

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::UsingDeclaration::UsingDeclaration
          (UsingDeclaration *this,Context *c,Identifier usingName,
          pool_ptr<soul::AST::Expression> *target)

{
  bool bVar1;
  bool local_4d;
  pool_ptr<soul::AST::Expression> local_38;
  string *local_30;
  pool_ptr<soul::AST::Expression> *local_28;
  pool_ptr<soul::AST::Expression> *target_local;
  Context *c_local;
  UsingDeclaration *this_local;
  Identifier usingName_local;
  
  local_30 = usingName.name;
  local_28 = target;
  target_local = (pool_ptr<soul::AST::Expression> *)c;
  c_local = (Context *)this;
  this_local = (UsingDeclaration *)usingName.name;
  TypeDeclarationBase::TypeDeclarationBase
            (&this->super_TypeDeclarationBase,UsingDeclaration,c,usingName);
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject
       = (_func_int **)&PTR__UsingDeclaration_00586800;
  (this->targetType).object = target->object;
  bVar1 = pool_ptr<soul::AST::Expression>::operator==(&this->targetType,(void *)0x0);
  local_4d = true;
  if (!bVar1) {
    local_38.object = (this->targetType).object;
    local_4d = isPossiblyType(&local_38);
  }
  checkAssertion(local_4d,"targetType == nullptr || isPossiblyType (targetType)","UsingDeclaration",
                 0x5ad);
  if (!bVar1) {
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_38);
  }
  return;
}

Assistant:

UsingDeclaration (const Context& c, Identifier usingName, pool_ptr<Expression> target)
            : TypeDeclarationBase (ObjectType::UsingDeclaration, c, usingName), targetType (target)
        {
            SOUL_ASSERT (targetType == nullptr || isPossiblyType (targetType));
        }